

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void request_handler_clbk(uint32_t cmd,char *data,uint32_t size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  string local_38;
  
  if (2 < size) {
    cVar1 = data[1];
    pcVar3 = "1";
    if (data[2] == '0') {
      pcVar3 = "0";
    }
    pcVar2 = "";
    if (data[2] == '0') {
      pcVar2 = "";
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar3,pcVar2);
    setLedState((GPIOClass *)
                (&ledPool +
                (long)(short)(((short)cVar1 -
                              (((short)(((int)cVar1 - 0x30U & 0xffff) >> 0xf) + (short)cVar1) -
                               0x30U & 0xfffe)) + -0x30) * 4),&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void request_handler_clbk(uint32_t cmd, char const * data, uint32_t size) 
{    
	if(size > 2)
    {
        int led_i = int(data[1]-'0') % LEDS_CNT;
        setLedState(&ledPool[led_i], (data[2] != '0') ? LED_SET_STATE : LED_RESET_STATE);
    }
}